

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

AddressParts *
gen_lea_modrm_0(AddressParts *__return_storage_ptr__,CPUX86State *env,DisasContext *s,int modrm)

{
  TCGContext *tcg_ctx;
  uint32_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  long lVar4;
  AddressParts *pAVar5;
  uint uVar6;
  long arg2;
  uint uVar7;
  undefined8 unaff_RBX;
  uint uVar8;
  uint uVar9;
  undefined8 unaff_R12;
  AddressParts *pAVar10;
  uint uVar11;
  TCGArg unaff_R13;
  uint uVar12;
  int iVar13;
  
  uVar12 = (uint)modrm >> 6 & 3;
  uVar9 = modrm & 7;
  uVar8 = s->rex_b | uVar9;
  uVar11 = 3;
  uVar6 = 0xffffffff;
  uVar3 = 0;
  uVar7 = 3;
  if (uVar12 == 3) goto LAB_005347fa;
  if (s->aflag - MO_32 < 2) {
    if (uVar9 == 4) {
      uVar2 = advance_pc(env,s,1);
      uVar1 = cpu_ldub_code_x86_64(env,uVar2);
      uVar7 = uVar1 >> 6 & 3;
      uVar8 = uVar1 >> 3 & 7 | s->rex_x;
      uVar6 = 0xffffffff;
      if (uVar8 != 4) {
        uVar6 = uVar8;
      }
      uVar8 = uVar1 & 7 | s->rex_b;
    }
    else {
      uVar6 = 0xffffffff;
      uVar7 = 0;
    }
    if (uVar12 == 1) {
      uVar2 = advance_pc(env,s,1);
      uVar1 = cpu_ldub_code_x86_64(env,uVar2);
      uVar3 = (ulong)(char)uVar1;
    }
    else if (uVar12 == 0) {
      if ((uVar8 & 7) == 5) {
        uVar2 = advance_pc(env,s,4);
        uVar1 = cpu_ldl_code_x86_64(env,uVar2);
        uVar3 = (ulong)(int)uVar1;
        uVar8 = 0xffffffff;
        if ((uVar9 != 4) && (s->code64 != 0)) {
          uVar3 = uVar3 + s->pc + (long)s->rip_offset;
          uVar8 = 0xfffffffe;
        }
      }
      else {
        uVar3 = 0;
      }
    }
    else {
      uVar2 = advance_pc(env,s,4);
      uVar1 = cpu_ldl_code_x86_64(env,uVar2);
      uVar3 = (ulong)(int)uVar1;
    }
    if ((uVar8 == 4) && ((long)s->popl_esp_hack != 0)) {
      uVar3 = uVar3 + (long)s->popl_esp_hack;
    }
    uVar11 = (uVar8 & 0xfffffffe) == 4 ^ 3;
    uVar9 = uVar7;
    goto switchD_00534a6f_caseD_0;
  }
  if (s->aflag != MO_16) {
    gen_lea_modrm_0_cold_1();
    tcg_ctx = *(TCGContext **)(__return_storage_ptr__[0x14].disp + 0x2e8);
    lVar4 = (long)(int)unaff_R12;
    iVar13 = (int)((ulong)unaff_RBX >> 0x20);
    if (lVar4 < 0) {
      if ((long)iVar13 < 0) {
        pAVar5 = (AddressParts *)0x0;
        goto LAB_00534b7e;
      }
      pAVar10 = (AddressParts *)(tcg_ctx->cpu_regs + iVar13);
    }
    else {
      arg2 = (long)(int)((ulong)unaff_R12 >> 0x20);
      if (arg2 == 0) {
        pAVar5 = (AddressParts *)(tcg_ctx->cpu_regs + lVar4);
      }
      else {
        pAVar5 = __return_storage_ptr__ + 9;
        tcg_gen_shli_i64_x86_64
                  (tcg_ctx,*(TCGv_i64 *)(__return_storage_ptr__ + 9),tcg_ctx->cpu_regs[lVar4],arg2);
      }
      pAVar5 = *(AddressParts **)pAVar5;
      if ((long)iVar13 < 0) goto LAB_00534b7e;
      pAVar10 = __return_storage_ptr__ + 9;
      tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_add_i64,
                         (long)&tcg_ctx->pool_cur + *(long *)(__return_storage_ptr__ + 9),
                         (TCGArg)((long)&tcg_ctx->pool_cur + (long)&pAVar5->def_seg),
                         (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_regs[iVar13]));
    }
    pAVar5 = *(AddressParts **)pAVar10;
LAB_00534b7e:
    if (pAVar5 == (AddressParts *)0x0) {
      tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_movi_i64,
                         (long)&tcg_ctx->pool_cur + *(long *)(__return_storage_ptr__ + 9),unaff_R13)
      ;
    }
    else {
      if (unaff_R13 == 0) {
        return pAVar5;
      }
      tcg_gen_addi_i64_x86_64
                (tcg_ctx,*(TCGv_i64 *)(__return_storage_ptr__ + 9),(TCGv_i64)pAVar5,unaff_R13);
    }
    return *(AddressParts **)(__return_storage_ptr__ + 9);
  }
  if (uVar12 == 1) {
    uVar2 = advance_pc(env,s,1);
    uVar1 = cpu_ldub_code_x86_64(env,uVar2);
    uVar3 = (ulong)(char)uVar1;
    uVar8 = 3;
    uVar6 = 6;
    uVar7 = 3;
    uVar11 = 3;
    uVar12 = 3;
    switch(uVar9) {
    case 0:
      goto switchD_00534a6f_caseD_0;
    case 2:
      goto switchD_00534a6f_caseD_2;
    case 3:
      goto switchD_00534a6f_caseD_3;
    case 4:
      goto switchD_00534a6f_caseD_4;
    case 5:
      goto switchD_00534a6f_caseD_5;
    case 6:
      goto switchD_00534a6f_caseD_6;
    case 7:
      goto switchD_00534a6f_caseD_7;
    }
    goto switchD_00534a6f_caseD_1;
  }
  if (uVar12 == 0) {
    uVar3 = 0;
    if (uVar9 == 6) {
      uVar2 = advance_pc(env,s,2);
      uVar1 = cpu_lduw_code_x86_64(env,uVar2);
      uVar3 = (ulong)(uVar1 & 0xffff);
      uVar6 = 0xffffffff;
      uVar9 = 0;
      uVar8 = 0xffffffff;
      goto switchD_00534a6f_caseD_0;
    }
  }
  else {
    uVar2 = advance_pc(env,s,2);
    uVar1 = cpu_lduw_code_x86_64(env,uVar2);
    uVar3 = (ulong)(short)uVar1;
  }
  uVar8 = 3;
  uVar6 = 6;
  uVar7 = 3;
  uVar11 = 3;
  uVar12 = 3;
  switch(uVar9) {
  case 0:
    goto switchD_00534a6f_caseD_0;
  case 1:
    goto switchD_00534a6f_caseD_1;
  case 2:
switchD_00534a6f_caseD_2:
    uVar6 = 6;
    uVar8 = 5;
    uVar7 = 2;
    goto LAB_005347fa;
  case 3:
switchD_00534a6f_caseD_3:
    uVar7 = 2;
    uVar8 = 5;
    goto switchD_00534a6f_caseD_1;
  case 4:
switchD_00534a6f_caseD_4:
    uVar8 = 6;
    uVar12 = 3;
    break;
  case 5:
switchD_00534a6f_caseD_5:
    uVar8 = 7;
    uVar12 = 3;
    break;
  case 6:
switchD_00534a6f_caseD_6:
    uVar8 = 5;
    uVar12 = 2;
  }
switchD_00534a6f_caseD_7:
  uVar11 = uVar12;
  uVar9 = 0;
  uVar6 = 0xffffffff;
switchD_00534a6f_caseD_0:
  __return_storage_ptr__->def_seg = uVar11;
  __return_storage_ptr__->base = uVar8;
  __return_storage_ptr__->index = uVar6;
  __return_storage_ptr__->scale = uVar9;
  __return_storage_ptr__->disp = uVar3;
  return __return_storage_ptr__;
switchD_00534a6f_caseD_1:
  uVar6 = 7;
LAB_005347fa:
  uVar11 = uVar7;
  uVar9 = 0;
  goto switchD_00534a6f_caseD_0;
}

Assistant:

static AddressParts gen_lea_modrm_0(CPUX86State *env, DisasContext *s,
                                    int modrm)
{
    int def_seg, base, index, scale, mod, rm;
    target_long disp;
    bool havesib;

    def_seg = R_DS;
    index = -1;
    scale = 0;
    disp = 0;

    mod = (modrm >> 6) & 3;
    rm = modrm & 7;
    base = rm | REX_B(s);

    if (mod == 3) {
        /* Normally filtered out earlier, but including this path
           simplifies multi-byte nop, as well as bndcl, bndcu, bndcn.  */
        goto done;
    }

    switch (s->aflag) {
    case MO_64:
    case MO_32:
        havesib = 0;
        if (rm == 4) {
            int code = x86_ldub_code(env, s);
            scale = (code >> 6) & 3;
            index = ((code >> 3) & 7) | REX_X(s);
            if (index == 4) {
                index = -1;  /* no index */
            }
            base = (code & 7) | REX_B(s);
            havesib = 1;
        }

        switch (mod) {
        case 0:
            if ((base & 7) == 5) {
                base = -1;
                disp = (int32_t)x86_ldl_code(env, s);
                if (CODE64(s) && !havesib) {
                    base = -2;
                    disp += s->pc + s->rip_offset;
                }
            }
            break;
        case 1:
            disp = (int8_t)x86_ldub_code(env, s);
            break;
        default:
        case 2:
            disp = (int32_t)x86_ldl_code(env, s);
            break;
        }

        /* For correct popl handling with esp.  */
        if (base == R_ESP && s->popl_esp_hack) {
            disp += s->popl_esp_hack;
        }
        if (base == R_EBP || base == R_ESP) {
            def_seg = R_SS;
        }
        break;

    case MO_16:
        if (mod == 0) {
            if (rm == 6) {
                base = -1;
                disp = x86_lduw_code(env, s);
                break;
            }
        } else if (mod == 1) {
            disp = (int8_t)x86_ldub_code(env, s);
        } else {
            disp = (int16_t)x86_lduw_code(env, s);
        }

        switch (rm) {
        case 0:
            base = R_EBX;
            index = R_ESI;
            break;
        case 1:
            base = R_EBX;
            index = R_EDI;
            break;
        case 2:
            base = R_EBP;
            index = R_ESI;
            def_seg = R_SS;
            break;
        case 3:
            base = R_EBP;
            index = R_EDI;
            def_seg = R_SS;
            break;
        case 4:
            base = R_ESI;
            break;
        case 5:
            base = R_EDI;
            break;
        case 6:
            base = R_EBP;
            def_seg = R_SS;
            break;
        default:
        case 7:
            base = R_EBX;
            break;
        }
        break;

    default:
        tcg_abort();
    }

 done:
    return (AddressParts){ def_seg, base, index, scale, disp };
}